

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * pack9_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  uVar2 = (in[1] - base) * 0x200 | uVar1 - base;
  *out = uVar2;
  uVar2 = (in[2] - base) * 0x40000 | uVar2;
  *out = uVar2;
  *out = (in[3] - base) * 0x8000000 | uVar2;
  uVar2 = in[3] - base >> 5;
  out[1] = uVar2;
  uVar2 = (in[4] - base) * 0x10 | uVar2;
  out[1] = uVar2;
  uVar2 = (in[5] - base) * 0x2000 | uVar2;
  out[1] = uVar2;
  uVar2 = (in[6] - base) * 0x400000 | uVar2;
  out[1] = uVar2;
  out[1] = (in[7] - base) * -0x80000000 | uVar2;
  out[2] = in[7] - base >> 1;
  return out + 3;
}

Assistant:

uint32_t * pack9_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 9  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 9  -  8 );
    ++in;

    return out + 1;
}